

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::doWalkModule(I64ToI32Lowering *this,Module *module)

{
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> __v;
  char *pcVar1;
  Builder *this_00;
  I64ToI32Lowering *pIVar2;
  pointer __p;
  pointer __p_00;
  Const *pCVar3;
  int64_t iVar4;
  Global *curr;
  long lVar5;
  char *extraout_RDX;
  long lVar6;
  __ireturn_type _Var7;
  Name NVar8;
  Name n;
  Name name;
  anon_union_16_6_1532cd5a_for_Literal_0 local_1e8;
  undefined8 local_1d8;
  _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_60;
  long local_58;
  I64ToI32Lowering *local_50;
  Module *local_48;
  _Head_base<0UL,_wasm::Global_*,_false> local_40;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> high;
  
  high._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)&this->builder;
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    __p_00 = (pointer)operator_new(8);
    __p_00->wasm = module;
    local_1e8.i64 = 0;
    std::__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>::reset
              ((__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               high._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,__p_00);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&local_1e8.func);
  }
  lVar5 = (long)(module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_60 = (_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->originallyI64Globals;
  lVar6 = 0;
  local_58 = lVar5;
  local_50 = this;
  local_48 = module;
  do {
    if (lVar5 == lVar6) {
      curr = (Global *)operator_new(0x50);
      pIVar2 = local_50;
      (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (curr->type).id = 0;
      *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
      (curr->super_Importable).module.super_IString.str._M_len = 0;
      (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      (curr->super_Importable).base.super_IString.str._M_len = 0;
      curr->init = (Expression *)0x0;
      *(undefined8 *)&curr->mutable_ = 0;
      (curr->type).id = 2;
      pcVar1 = DAT_01174df8;
      (curr->super_Importable).super_Named.name.super_IString.str._M_len = INT64_TO_32_HIGH_BITS;
      (curr->super_Importable).super_Named.name.super_IString.str._M_str = pcVar1;
      pCVar3 = Builder::makeConst<int>
                         ((local_50->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0);
      curr->init = (Expression *)pCVar3;
      curr->mutable_ = true;
      Module::addGlobal(module,curr);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::doWalkModule
                (&(pIVar2->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,module);
      return;
    }
    __v._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
         (module->globals).
         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
         super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
    if ((((value_type *)
         ((long)__v._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x30))->super_IString).
        str._M_str == (char *)0x3) {
      _Var7 = std::__detail::
              _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::insert(local_60,(value_type *)
                                __v._M_t.
                                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
      NVar8.super_IString.str._M_str = _Var7._8_8_;
      (((value_type *)
       ((long)__v._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x30))->super_IString).str
      ._M_str = (char *)0x2;
      NVar8.super_IString.str._M_len =
           (size_t)*(char **)((long)__v._M_t.
                                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                    .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 8);
      NVar8 = makeHighName(*(wasm **)__v._M_t.
                                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                     .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,
                           NVar8);
      pCVar3 = Builder::makeConst<int>
                         (*(Builder **)
                           high._M_t.
                           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,0);
      name.super_IString.str._M_str = NVar8.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)&local_40;
      Builder::makeGlobal(name,(Type)NVar8.super_IString.str._M_str,(Expression *)0x2,
                          (Mutability)pCVar3);
      if ((((value_type *)
           ((long)__v._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20))->super_IString)
          .str._M_len != 0) {
        Fatal::Fatal((Fatal *)&local_1e8.func);
        Fatal::operator<<((Fatal *)&local_1e8.func,(char (*) [27])"TODO: imported i64 globals");
        Fatal::~Fatal((Fatal *)&local_1e8.func);
      }
      pcVar1 = (char *)(((value_type *)
                        ((long)__v._M_t.
                               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                               .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40))->
                       super_IString).str._M_len;
      if (*pcVar1 == '\n') {
        this_00 = *(Builder **)
                   high._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                   ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        n.super_IString.str._M_str = extraout_RDX;
        n.super_IString.str._M_len = *(size_t *)(pcVar1 + 0x18);
        NVar8 = makeHighName(*(wasm **)(pcVar1 + 0x10),n);
        pCVar3 = (Const *)Builder::makeGlobalGet(this_00,NVar8,(Type)0x2);
      }
      else {
        if (*pcVar1 != '\x0e') {
          handle_unreachable("unexpected expression type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                             ,0x8a);
        }
        iVar4 = Literal::geti64((Literal *)(pcVar1 + 0x10));
        local_1e8.i32 = (int)iVar4;
        local_1d8 = 2;
        Literal::operator=((Literal *)(pcVar1 + 0x10),(Literal *)&local_1e8.func);
        Literal::~Literal((Literal *)&local_1e8.func);
        pcVar1[8] = '\x02';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        pCVar3 = Builder::makeConst<unsigned_int>
                           (*(Builder **)
                             high._M_t.
                             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                             .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,
                            (uint)((ulong)iVar4 >> 0x20));
      }
      module = local_48;
      (local_40._M_head_impl)->init = (Expression *)pCVar3;
      *(undefined8 *)
       ((((value_type *)
         ((long)__v._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40))->super_IString).
        str._M_len + 8) = 2;
      Module::addGlobal(local_48,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                                 &local_40);
      std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_40);
      lVar5 = local_58;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void doWalkModule(Module* module) {
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    // add new globals for high bits
    for (size_t i = 0, globals = module->globals.size(); i < globals; ++i) {
      auto* curr = module->globals[i].get();
      if (curr->type != Type::i64) {
        continue;
      }
      originallyI64Globals.insert(curr->name);
      curr->type = Type::i32;
      auto high = builder->makeGlobal(makeHighName(curr->name),
                                      Type::i32,
                                      builder->makeConst(int32_t(0)),
                                      curr->mutable_ ? Builder::Mutable
                                                     : Builder::Immutable);
      if (curr->imported()) {
        Fatal() << "TODO: imported i64 globals";
      } else {
        if (auto* c = curr->init->dynCast<Const>()) {
          uint64_t value = c->value.geti64();
          c->value = Literal(uint32_t(value));
          c->type = Type::i32;
          high->init = builder->makeConst(uint32_t(value >> 32));
        } else if (auto* get = curr->init->dynCast<GlobalGet>()) {
          high->init =
            builder->makeGlobalGet(makeHighName(get->name), Type::i32);
        } else {
          WASM_UNREACHABLE("unexpected expression type");
        }
        curr->init->type = Type::i32;
      }
      module->addGlobal(std::move(high));
    }

    // For functions that return 64-bit values, we use this global variable
    // to return the high 32 bits.
    auto* highBits = new Global();
    highBits->type = Type::i32;
    highBits->name = INT64_TO_32_HIGH_BITS;
    highBits->init = builder->makeConst(int32_t(0));
    highBits->mutable_ = true;
    module->addGlobal(highBits);
    PostWalker<I64ToI32Lowering>::doWalkModule(module);
  }